

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9Equiv3(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *pAbc_00;
  int iVar1;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  Ssw_RarPars_t *pPars;
  Ssw_RarPars_t Pars;
  Ssw_RarPars_t local_98;
  Abc_Frame_t *local_38;
  
  local_38 = pAbc;
  Ssw_RarSetDefaultParams(&local_98);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"FWBRSNTmxlvh"), pAbc_00 = local_38,
          iVar3 = globalUtilOptind, 0x6b < iVar1) {
      if (iVar1 < 0x76) {
        if (iVar1 == 0x6c) {
          local_98.fLatchOnly = local_98.fLatchOnly ^ 1;
        }
        else {
          if (iVar1 != 0x6d) goto switchD_00228db0_caseD_4f;
          local_98.fMiter = local_98.fMiter ^ 1;
        }
      }
      else if (iVar1 == 0x76) {
        local_98.fVerbose = local_98.fVerbose ^ 1;
      }
      else {
        if (iVar1 != 0x78) goto switchD_00228db0_caseD_4f;
        local_98.fUseCex = local_98.fUseCex ^ 1;
      }
    }
    if (iVar1 < 0x4e) {
      if (iVar1 == 0x42) {
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-B\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nBinSize = uVar2;
      }
      else {
        if (iVar1 != 0x46) {
          if (iVar1 == -1) {
            if (local_38->pGia != (Gia_Man_t *)0x0) {
              if (local_38->pGia->nRegs == 0) {
                pcVar4 = "Abc_CommandAbc9Equiv3(): There is no flops. Nothing is done.\n";
LAB_00229174:
                Abc_Print(0,pcVar4);
                return 0;
              }
              if (local_98.fUseCex != 0) {
                if (local_98.fMiter != 0) {
                  Abc_Print(0,
                            "Abc_CommandAbc9Equiv3(): Considering the miter as a circuit because the CEX is given.\n"
                           );
                  local_98.fMiter = 0;
                }
                local_98.pCex = pAbc_00->pCex;
                if (local_98.pCex == (Abc_Cex_t *)0x0) {
                  pcVar4 = "Abc_CommandAbc9Equiv3(): Counter-example is not available.\n";
                  goto LAB_00229174;
                }
                if ((local_98.pCex)->nPis != pAbc_00->pGia->vCis->nSize - pAbc_00->pGia->nRegs) {
                  Abc_Print(-1,
                            "Abc_CommandAbc9Equiv3(): The number of PIs differs in cex (%d) and in AIG (%d).\n"
                           );
                  return 1;
                }
              }
              iVar3 = Ssw_RarSignalFilterGia(pAbc_00->pGia,&local_98);
              pAbc_00->Status = iVar3;
              Abc_FrameReplaceCex(pAbc_00,&pAbc_00->pGia->pCexSeq);
              return 0;
            }
            pcVar4 = "Abc_CommandAbc9Equiv3(): There is no AIG.\n";
            iVar3 = -1;
            goto LAB_00229139;
          }
          break;
        }
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-F\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nFrames = uVar2;
      }
    }
    else {
      switch(iVar1) {
      case 0x4e:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-N\" should be followed by an integer.\n";
LAB_00228fdd:
          Abc_Print(-1,pcVar4);
          goto switchD_00228db0_caseD_4f;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nRandSeed = uVar2;
        break;
      default:
        goto switchD_00228db0_caseD_4f;
      case 0x52:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-R\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nRounds = uVar2;
        break;
      case 0x53:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-S\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nRestart = uVar2;
        break;
      case 0x54:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-T\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.TimeOut = uVar2;
        break;
      case 0x57:
        if (argc <= globalUtilOptind) {
          pcVar4 = "Command line switch \"-W\" should be followed by an integer.\n";
          goto LAB_00228fdd;
        }
        uVar2 = atoi(argv[globalUtilOptind]);
        local_98.nWords = uVar2;
      }
    }
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)uVar2);
switchD_00228db0_caseD_4f:
  Abc_Print(-2,"usage: &equiv3 [-FWRSNT num] [-mxlvh]\n");
  Abc_Print(-2,"\t         computes candidate equivalence classes\n");
  Abc_Print(-2,"\t-F num : the max number of frames for BMC [default = %d]\n",
            (ulong)(uint)local_98.nFrames);
  Abc_Print(-2,"\t-W num : the number of words to simulate [default = %d]\n",
            (ulong)(uint)local_98.nWords);
  Abc_Print(-2,"\t-R num : the max number of simulation rounds [default = %d]\n",
            (ulong)(uint)local_98.nRounds);
  Abc_Print(-2,"\t-S num : the number of rounds before a restart [default = %d]\n",
            (ulong)(uint)local_98.nRestart);
  Abc_Print(-2,"\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",
            (ulong)(uint)local_98.nRandSeed);
  Abc_Print(-2,"\t-T num : runtime limit in seconds for all rounds [default = %d]\n",
            (ulong)(uint)local_98.TimeOut);
  pcVar4 = "miter";
  if (local_98.fMiter == 0) {
    pcVar4 = "circuit";
  }
  Abc_Print(-2,"\t-m     : toggle miter vs. any circuit [default = %s]\n",pcVar4);
  pcVar5 = "yes";
  pcVar4 = "yes";
  if (local_98.fUseCex == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-x     : toggle using the current CEX to perform refinement [default = %s]\n",
            pcVar4);
  pcVar4 = "yes";
  if (local_98.fLatchOnly == 0) {
    pcVar4 = "no";
  }
  Abc_Print(-2,"\t-l     : toggle considering only latch output equivalences [default = %s]\n",
            pcVar4);
  if (local_98.fVerbose == 0) {
    pcVar5 = "no";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
  pcVar4 = "\t-h     : print the command usage\n";
  iVar3 = -2;
LAB_00229139:
  Abc_Print(iVar3,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandAbc9Equiv3( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Ssw_RarSignalFilterGia( Gia_Man_t * p, Ssw_RarPars_t * pPars );
    Ssw_RarPars_t Pars, * pPars = &Pars;
    int c;
    Ssw_RarSetDefaultParams( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FWBRSNTmxlvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFrames = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFrames < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nWords < 0 )
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nBinSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nBinSize < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRounds = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRounds < 0 )
                goto usage;
            break;
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRestart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRestart < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nRandSeed = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nRandSeed < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 )
                goto usage;
            break;
        case 'm':
            pPars->fMiter ^= 1;
            break;
        case 'x':
            pPars->fUseCex ^= 1;
            break;
        case 'l':
            pPars->fLatchOnly ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Equiv3(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( 0, "Abc_CommandAbc9Equiv3(): There is no flops. Nothing is done.\n" );
        return 0;
    }
    if ( pPars->fUseCex )
    {
        if ( pPars->fMiter )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv3(): Considering the miter as a circuit because the CEX is given.\n" );
            pPars->fMiter = 0;
        }
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( 0, "Abc_CommandAbc9Equiv3(): Counter-example is not available.\n" );
            return 0;
        }
        if ( pAbc->pCex->nPis != Gia_ManPiNum(pAbc->pGia) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Equiv3(): The number of PIs differs in cex (%d) and in AIG (%d).\n",
                pAbc->pCex->nPis, Gia_ManPiNum(pAbc->pGia) );
            return 1;
        }
        pPars->pCex = pAbc->pCex;
    }
    pAbc->Status = Ssw_RarSignalFilterGia( pAbc->pGia, pPars );
//    pAbc->nFrames = pAbc->pGia->pCexSeq->iFrame;
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &equiv3 [-FWRSNT num] [-mxlvh]\n" );
    Abc_Print( -2, "\t         computes candidate equivalence classes\n" );
    Abc_Print( -2, "\t-F num : the max number of frames for BMC [default = %d]\n",                   pPars->nFrames );
    Abc_Print( -2, "\t-W num : the number of words to simulate [default = %d]\n",                    pPars->nWords );
    Abc_Print( -2, "\t-R num : the max number of simulation rounds [default = %d]\n",                pPars->nRounds );
    Abc_Print( -2, "\t-S num : the number of rounds before a restart [default = %d]\n",              pPars->nRestart );
    Abc_Print( -2, "\t-N num : random number seed (1 <= num <= 1000) [default = %d]\n",              pPars->nRandSeed );
    Abc_Print( -2, "\t-T num : runtime limit in seconds for all rounds [default = %d]\n",            pPars->TimeOut );
    Abc_Print( -2, "\t-m     : toggle miter vs. any circuit [default = %s]\n",                       pPars->fMiter? "miter": "circuit" );
    Abc_Print( -2, "\t-x     : toggle using the current CEX to perform refinement [default = %s]\n", pPars->fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle considering only latch output equivalences [default = %s]\n",  pPars->fLatchOnly? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}